

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pqmf.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  ostream *poVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_13;
  ostringstream error_message_12;
  int i;
  int n;
  ostringstream error_message_11;
  ostringstream error_message_10;
  int num_read;
  int delay;
  vector<double,_std::allocator<double>_> output;
  double input;
  ostringstream error_message_9;
  Buffer buffer;
  PseudoQuadratureMirrorFilterBanks analysis;
  istream *input_stream;
  ostringstream error_message_8;
  ifstream ifs;
  ostringstream error_message_7;
  char *input_file;
  ostringstream error_message_6;
  int num_input_files;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool delay_compensation;
  double initial_step_size;
  double convergence_threshold;
  int num_iteration;
  double attenuation;
  int num_filter_order;
  int num_subband;
  option *in_stack_ffffffffffffe388;
  allocator *paVar10;
  undefined7 in_stack_ffffffffffffe390;
  undefined1 in_stack_ffffffffffffe397;
  string *in_stack_ffffffffffffe398;
  undefined4 in_stack_ffffffffffffe3a0;
  int in_stack_ffffffffffffe3a4;
  size_type in_stack_ffffffffffffe3a8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe3b0;
  undefined7 in_stack_ffffffffffffe3b8;
  undefined1 in_stack_ffffffffffffe3bf;
  int *in_stack_ffffffffffffe3c0;
  undefined4 in_stack_ffffffffffffe3c8;
  undefined2 in_stack_ffffffffffffe3cc;
  undefined1 in_stack_ffffffffffffe3ce;
  undefined1 in_stack_ffffffffffffe3cf;
  undefined4 in_stack_ffffffffffffe3d0;
  int iVar11;
  undefined4 in_stack_ffffffffffffe3d4;
  undefined4 uVar12;
  undefined8 in_stack_ffffffffffffe3d8;
  PseudoQuadratureMirrorFilterBanks *in_stack_ffffffffffffe3e0;
  undefined1 *puVar13;
  undefined7 in_stack_ffffffffffffe3f0;
  vector<double,_std::allocator<double>_> *output_00;
  undefined7 in_stack_ffffffffffffe400;
  PseudoQuadratureMirrorFilterBanks *in_stack_ffffffffffffe408;
  char *local_1bc0;
  bool local_1b92;
  bool local_1b6a;
  bool local_1b42;
  bool local_1b1a;
  bool local_1af2;
  bool local_1aca;
  allocator local_1aa9;
  string local_1aa8 [32];
  ostringstream *in_stack_ffffffffffffe578;
  string *in_stack_ffffffffffffe580;
  allocator local_1909;
  string local_1908 [32];
  ostringstream local_18e8 [380];
  int local_176c;
  int local_1768;
  allocator local_1761;
  string local_1760 [32];
  ostringstream local_1740 [383];
  allocator local_15c1;
  string local_15c0 [32];
  ostringstream local_15a0 [380];
  int local_1424;
  int local_1420;
  undefined1 local_1419 [40];
  allocator local_13f1;
  string local_13f0 [32];
  ostringstream local_13d0 [408];
  PseudoQuadratureMirrorFilterBanks local_1238;
  vector<double,_std::allocator<double>_> *local_11f8;
  undefined4 local_11f0;
  allocator local_11e9;
  string local_11e8 [32];
  ostringstream local_11c8 [376];
  vector<double,_std::allocator<double>_> local_1050 [21];
  allocator local_e41;
  string local_e40 [32];
  ostringstream local_e20 [376];
  char *local_ca8;
  allocator local_c99;
  string local_c98 [32];
  ostringstream local_c78 [376];
  int local_b00;
  allocator local_af9;
  string local_af8 [32];
  ostringstream local_ad8 [383];
  allocator local_959;
  string local_958 [39];
  allocator local_931;
  string local_930 [32];
  ostringstream local_910 [383];
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [32];
  ostringstream local_748 [383];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  ostringstream local_580 [383];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [32];
  ostringstream local_3b8 [383];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  ostringstream local_1f0 [399];
  allocator local_61;
  string local_60 [32];
  int local_40;
  byte local_39;
  double local_38;
  double local_30;
  int local_24;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 4;
  local_18 = 0x2f;
  local_20 = 100.0;
  local_24 = 100;
  local_30 = 1e-06;
  local_38 = 0.01;
  local_39 = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_40 = ya_getopt_long(in_stack_ffffffffffffe3a4,(char **)in_stack_ffffffffffffe398,
                                   (char *)CONCAT17(in_stack_ffffffffffffe397,
                                                    in_stack_ffffffffffffe390),
                                   in_stack_ffffffffffffe388,(int *)0x1038c0), pcVar1 = ya_optarg,
        local_40 != -1) {
    switch(local_40) {
    case 0x61:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,pcVar1,&local_401);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffe398,
                         (double *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      local_1b1a = !bVar2 || local_20 <= 0.0;
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      if (local_1b1a) {
        std::__cxx11::ostringstream::ostringstream(local_580);
        std::operator<<((ostream *)local_580,
                        "The argument for the -a option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a0,"pqmf",&local_5a1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_580);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_246f::PrintUsage((ostream *)in_stack_ffffffffffffe3e0);
      return 1;
    case 100:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_790,pcVar1,&local_791);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffe398,
                         (double *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      local_1b6a = !bVar2 || local_30 < 0.0;
      std::__cxx11::string::~string(local_790);
      std::allocator<char>::~allocator((allocator<char> *)&local_791);
      if (local_1b6a) {
        std::__cxx11::ostringstream::ostringstream(local_910);
        std::operator<<((ostream *)local_910,
                        "The argument for the -d option must be a non-negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_930,"pqmf",&local_931);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_930);
        std::allocator<char>::~allocator((allocator<char> *)&local_931);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_910);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_246f::PrintUsage((ostream *)in_stack_ffffffffffffe3e0);
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,pcVar1,&local_5c9);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe398,
                         (int *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      local_1b42 = !bVar2 || local_24 < 1;
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
      if (local_1b42) {
        std::__cxx11::ostringstream::ostringstream(local_748);
        std::operator<<((ostream *)local_748,
                        "The argument for the -i option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_768,"pqmf",&local_769);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_768);
        std::allocator<char>::~allocator((allocator<char> *)&local_769);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_748);
        return local_4;
      }
      break;
    case 0x6b:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar1,&local_61);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe398,
                         (int *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      local_1aca = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      if (local_1aca) {
        std::__cxx11::ostringstream::ostringstream(local_1f0);
        std::operator<<((ostream *)local_1f0,
                        "The argument for the -k option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"pqmf",&local_211);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1f0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,pcVar1,&local_239);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe398,
                         (int *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      local_1af2 = !bVar2 || local_18 < 2;
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      if (local_1af2) {
        std::__cxx11::ostringstream::ostringstream(local_3b8);
        std::operator<<((ostream *)local_3b8,"The argument for the -m option must be greater than 1"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d8,"pqmf",&local_3d9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_3d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3b8);
        return local_4;
      }
      break;
    case 0x72:
      local_39 = 0;
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_958,pcVar1,&local_959);
      bVar2 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffe398,
                         (double *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      local_1b92 = !bVar2 || local_38 <= 0.0;
      std::__cxx11::string::~string(local_958);
      std::allocator<char>::~allocator((allocator<char> *)&local_959);
      if (local_1b92) {
        std::__cxx11::ostringstream::ostringstream(local_ad8);
        std::operator<<((ostream *)local_ad8,
                        "The argument for the -s option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_af8,"pqmf",&local_af9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_af8);
        std::allocator<char>::~allocator((allocator<char> *)&local_af9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_ad8);
        return local_4;
      }
    }
  }
  local_b00 = local_8 - ya_optind;
  if (1 < local_b00) {
    std::__cxx11::ostringstream::ostringstream(local_c78);
    std::operator<<((ostream *)local_c78,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c98,"pqmf",&local_c99);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
    std::__cxx11::string::~string(local_c98);
    std::allocator<char>::~allocator((allocator<char> *)&local_c99);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c78);
    return local_4;
  }
  if (local_b00 == 0) {
    local_1bc0 = (char *)0x0;
  }
  else {
    local_1bc0 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_ca8 = local_1bc0;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_e20);
    std::operator<<((ostream *)local_e20,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e40,"pqmf",&local_e41);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
    std::__cxx11::string::~string(local_e40);
    std::allocator<char>::~allocator((allocator<char> *)&local_e41);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e20);
    return local_4;
  }
  std::ifstream::ifstream(local_1050);
  pcVar1 = local_ca8;
  if (local_ca8 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_1050,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_11c8);
      poVar6 = std::operator<<((ostream *)local_11c8,"Cannot open file ");
      std::operator<<(poVar6,local_ca8);
      paVar10 = &local_11e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_11e8,"pqmf",paVar10);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
      std::__cxx11::string::~string(local_11e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
      local_4 = 1;
      local_11f0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_11c8);
      goto LAB_00105443;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    output_00 = (vector<double,_std::allocator<double>_> *)&std::cin;
  }
  else {
    output_00 = local_1050;
  }
  local_11f8 = output_00;
  sptk::PseudoQuadratureMirrorFilterBanks::PseudoQuadratureMirrorFilterBanks
            (in_stack_ffffffffffffe3e0,(int)((ulong)in_stack_ffffffffffffe3d8 >> 0x20),
             (int)in_stack_ffffffffffffe3d8,
             (double)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
             CONCAT13(in_stack_ffffffffffffe3cf,
                      CONCAT12(in_stack_ffffffffffffe3ce,in_stack_ffffffffffffe3cc)),
             (double)in_stack_ffffffffffffe3c0,
             (double)CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8));
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer::Buffer((Buffer *)0x104b8b);
  uVar4 = sptk::PseudoQuadratureMirrorFilterBanks::IsValid(&local_1238);
  if ((bool)uVar4) {
    lVar7 = (long)local_14;
    puVar13 = local_1419;
    std::allocator<double>::allocator((allocator<double> *)0x104d16);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffe3a4,in_stack_ffffffffffffe3a0));
    std::allocator<double>::~allocator((allocator<double> *)0x104d3c);
    bVar2 = sptk::IsEven(local_18);
    uVar12 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe3d4);
    iVar11 = local_18;
    if (!bVar2) {
      iVar11 = local_18 + -1;
    }
    iVar11 = iVar11 / 2;
    local_1424 = 0;
    local_1420 = iVar11;
    do {
      uVar5 = sptk::ReadStream<double>
                        ((double *)in_stack_ffffffffffffe398,
                         (istream *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      if (!(bool)uVar5) {
        if ((local_39 & 1) == 0) goto LAB_001053d7;
        piVar8 = std::min<int>(&local_1420,&local_1424);
        local_1768 = *piVar8;
        local_176c = 0;
        goto LAB_00105112;
      }
      in_stack_ffffffffffffe3ce =
           sptk::PseudoQuadratureMirrorFilterBanks::Run
                     (in_stack_ffffffffffffe408,(double)CONCAT17(bVar3,in_stack_ffffffffffffe400),
                      output_00,(Buffer *)CONCAT17(uVar4,in_stack_ffffffffffffe3f0));
      if (!(bool)in_stack_ffffffffffffe3ce) {
        std::__cxx11::ostringstream::ostringstream(local_15a0);
        std::operator<<((ostream *)local_15a0,"Failed to perform PQMF analysis");
        paVar10 = &local_15c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_15c0,"pqmf",paVar10);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
        std::__cxx11::string::~string(local_15c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_15c1);
        local_4 = 1;
        local_11f0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_15a0);
        goto LAB_001053ed;
      }
    } while ((((local_39 & 1) != 0) &&
             (iVar9 = local_1424 + 1, bVar2 = local_1424 < local_1420, local_1424 = iVar9, bVar2))
            || (bVar2 = sptk::WriteStream<double>
                                  ((int)puVar13,(int)((ulong)lVar7 >> 0x20),
                                   (vector<double,_std::allocator<double>_> *)
                                   CONCAT44(uVar12,iVar11),
                                   (ostream *)
                                   CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffe3ce,
                                                           CONCAT24(in_stack_ffffffffffffe3cc,
                                                                    in_stack_ffffffffffffe3c8))),
                                   in_stack_ffffffffffffe3c0), bVar2));
    std::__cxx11::ostringstream::ostringstream(local_1740);
    std::operator<<((ostream *)local_1740,"Failed to write subband signals");
    paVar10 = &local_1761;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1760,"pqmf",paVar10);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
    std::__cxx11::string::~string(local_1760);
    std::allocator<char>::~allocator((allocator<char> *)&local_1761);
    local_4 = 1;
    local_11f0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1740);
    goto LAB_001053ed;
  }
  std::__cxx11::ostringstream::ostringstream(local_13d0);
  std::operator<<((ostream *)local_13d0,"Failed to initialize PseudoQuadratureMirrorFilterBanks");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13f0,"pqmf",&local_13f1);
  sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
  std::__cxx11::string::~string(local_13f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f1);
  local_4 = 1;
  local_11f0 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_13d0);
LAB_0010540b:
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer::~Buffer
            ((Buffer *)CONCAT44(in_stack_ffffffffffffe3a4,in_stack_ffffffffffffe3a0));
  sptk::PseudoQuadratureMirrorFilterBanks::~PseudoQuadratureMirrorFilterBanks
            ((PseudoQuadratureMirrorFilterBanks *)
             CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
LAB_00105443:
  std::ifstream::~ifstream(local_1050);
  return local_4;
LAB_00105112:
  if (local_1768 <= local_176c) goto LAB_001053d7;
  bVar2 = sptk::PseudoQuadratureMirrorFilterBanks::Run
                    (in_stack_ffffffffffffe408,(double)CONCAT17(bVar3,in_stack_ffffffffffffe400),
                     output_00,(Buffer *)CONCAT17(uVar4,in_stack_ffffffffffffe3f0));
  in_stack_ffffffffffffe3a4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe3a4);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_18e8);
    std::operator<<((ostream *)local_18e8,"Failed to perform PQMF analysis");
    paVar10 = &local_1909;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1908,"pqmf",paVar10);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
    std::__cxx11::string::~string(local_1908);
    std::allocator<char>::~allocator((allocator<char> *)&local_1909);
    local_4 = 1;
    local_11f0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_18e8);
    goto LAB_001053ed;
  }
  in_stack_ffffffffffffe397 =
       sptk::WriteStream<double>
                 ((int)puVar13,(int)((ulong)lVar7 >> 0x20),
                  (vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,iVar11),
                  (ostream *)
                  CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffe3ce,
                                          CONCAT24(in_stack_ffffffffffffe3cc,
                                                   in_stack_ffffffffffffe3c8))),
                  in_stack_ffffffffffffe3c0);
  if (!(bool)in_stack_ffffffffffffe397) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xffffffffffffe578);
    std::operator<<((ostream *)&stack0xffffffffffffe578,"Failed to write subband signals");
    paVar10 = &local_1aa9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1aa8,"pqmf",paVar10);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
    std::__cxx11::string::~string(local_1aa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1aa9);
    local_4 = 1;
    local_11f0 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xffffffffffffe578);
    goto LAB_001053ed;
  }
  local_176c = local_176c + 1;
  goto LAB_00105112;
LAB_001053d7:
  local_4 = 0;
  local_11f0 = 1;
LAB_001053ed:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffe3a4,in_stack_ffffffffffffe3a0));
  goto LAB_0010540b;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_subband(kDefaultNumSubband);
  int num_filter_order(kDefaultNumFilterOrder);
  double attenuation(kDefaultAttenuation);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double initial_step_size(kDefaultInitialStepSize);
  bool delay_compensation(kDefaultDelayCompensation);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "k:m:a:i:d:s:rh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_subband) ||
            num_subband <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order <= 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -m option must be greater than 1";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &attenuation) ||
            attenuation <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be a positive number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -i option must be a positive integer";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &initial_step_size) ||
            initial_step_size <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'r': {
        delay_compensation = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pqmf", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PseudoQuadratureMirrorFilterBanks analysis(
      num_subband, num_filter_order, attenuation, num_iteration,
      convergence_threshold, initial_step_size);
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer buffer;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PseudoQuadratureMirrorFilterBanks";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }

  double input;
  std::vector<double> output(num_subband);
  const int delay(sptk::IsEven(num_filter_order) ? num_filter_order / 2
                                                 : (num_filter_order - 1) / 2);

  int num_read(0);
  while (sptk::ReadStream(&input, &input_stream)) {
    if (!analysis.Run(input, &output, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to perform PQMF analysis";
      sptk::PrintErrorMessage("pqmf", error_message);
      return 1;
    }
    if (!delay_compensation || delay <= num_read++) {
      if (!sptk::WriteStream(0, num_subband, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write subband signals";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
    }
  }

  if (delay_compensation) {
    const int n(std::min(delay, num_read));
    for (int i(0); i < n; ++i) {
      if (!analysis.Run(input, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to perform PQMF analysis";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, num_subband, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write subband signals";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
    }
  }

  return 0;
}